

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O0

char * ovf_latest_message(ovf_file *ovf_file_ptr)

{
  ovf_file *ovf_file_ptr_local;
  
  if (ovf_file_ptr == (ovf_file *)0x0) {
    ovf_file_ptr_local = (ovf_file *)0x1d6b50;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&ovf_file_ptr->_state->message_out,
               (string *)&ovf_file_ptr->_state->message_latest);
    std::__cxx11::string::operator=((string *)&ovf_file_ptr->_state->message_latest,"");
    ovf_file_ptr_local = (ovf_file *)std::__cxx11::string::c_str();
  }
  return (char *)ovf_file_ptr_local;
}

Assistant:

const char * ovf_latest_message(struct ovf_file *ovf_file_ptr)
try
{
    if( !ovf_file_ptr )
        return "";

    ovf_file_ptr->_state->message_out = ovf_file_ptr->_state->message_latest;
    ovf_file_ptr->_state->message_latest = "";
    return ovf_file_ptr->_state->message_out.c_str();
}
catch( ... )
{
    return "";
}